

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

Arg * __thiscall fmt::ArgList::operator[](Arg *__return_storage_ptr__,ArgList *this,uint index)

{
  LongLong *pLVar1;
  Type *pTVar2;
  ulong uVar3;
  Arg *pAVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Type TVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  LongLong local_18;
  size_t sStack_10;
  
  uVar3 = this->types_;
  if (index < 0x10) {
    uVar6 = uVar3 >> ((char)index * '\x04' & 0x3fU);
    if ((uVar6 & 0xf) != 0) {
      pLVar1 = (LongLong *)
               ((long)&((this->field_1).values_)->field_0 +
               ((ulong)index << (uVar3 >> 0x3c == 0 ^ 5U)));
      local_18 = *pLVar1;
      sStack_10 = pLVar1[1];
    }
    (__return_storage_ptr__->super_Value).field_0.long_long_value = local_18;
    (__return_storage_ptr__->super_Value).field_0.string.size = sStack_10;
    __return_storage_ptr__->type = (Type)uVar6 & (CUSTOM|NAMED_ARG);
    return __return_storage_ptr__;
  }
  if (uVar3 >> 0x3c == 0) {
    __return_storage_ptr__->type = NONE;
    return __return_storage_ptr__;
  }
  uVar5 = 0x10;
  do {
    if ((this->field_1).args_[uVar5].type == NONE) {
      pAVar4 = (this->field_1).args_ + uVar5;
      iVar7 = (pAVar4->super_Value).field_0.int_value;
      uVar8 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 4);
      uVar9 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 8);
      uVar10 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 0xc);
      TVar11 = pAVar4->type;
      uVar12 = *(undefined4 *)&pAVar4->field_0x14;
      uVar13 = *(undefined4 *)&pAVar4->field_0x18;
      uVar14 = *(undefined4 *)&pAVar4->field_0x1c;
      goto LAB_0016dce0;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 <= index);
  pAVar4 = (this->field_1).args_ + index;
  iVar7 = (pAVar4->super_Value).field_0.int_value;
  uVar8 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 4);
  uVar9 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 8);
  uVar10 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 0xc);
  pTVar2 = &(this->field_1).args_[index].type;
  TVar11 = *pTVar2;
  uVar12 = pTVar2[1];
  uVar13 = pTVar2[2];
  uVar14 = pTVar2[3];
LAB_0016dce0:
  __return_storage_ptr__->type = TVar11;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar12;
  *(undefined4 *)&__return_storage_ptr__->field_0x18 = uVar13;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar14;
  (__return_storage_ptr__->super_Value).field_0.int_value = iVar7;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 4) = uVar8;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 8) = uVar9;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 0xc) = uVar10;
  return __return_storage_ptr__;
}

Assistant:

internal::Arg operator[](unsigned index) const {
    using internal::Arg;
    Arg arg;
    bool use_values = type(MAX_PACKED_ARGS - 1) == Arg::NONE;
    if (index < MAX_PACKED_ARGS) {
      Arg::Type arg_type = type(index);
      internal::Value &val = arg;
      if (arg_type != Arg::NONE)
        val = use_values ? values_[index] : args_[index];
      arg.type = arg_type;
      return arg;
    }
    if (use_values) {
      // The index is greater than the number of arguments that can be stored
      // in values, so return a "none" argument.
      arg.type = Arg::NONE;
      return arg;
    }
    for (unsigned i = MAX_PACKED_ARGS; i <= index; ++i) {
      if (args_[i].type == Arg::NONE)
        return args_[i];
    }
    return args_[index];
  }